

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.cc
# Opt level: O0

void __thiscall pstack::Context::~Context(Context *this)

{
  bool bVar1;
  ostream *poVar2;
  void *this_00;
  reference __in;
  __shared_ptr_access<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_01;
  element_type *peVar3;
  element_type *reader;
  type *elf;
  type *name;
  _Self local_28;
  iterator __end2;
  iterator __begin2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pstack::Elf::Object>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pstack::Elf::Object>_>_>_>
  *__range2;
  Context *this_local;
  
  if (1 < this->verbose) {
    poVar2 = std::operator<<(this->debug,"image cache: lookups: ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,dwarfLookups);
    poVar2 = std::operator<<(poVar2,", hits=");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,dwarfHits);
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"ELF image cache: lookups: ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,elfLookups);
    poVar2 = std::operator<<(poVar2,", hits=");
    this_00 = (void *)std::ostream::operator<<(poVar2,elfHits);
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    __end2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pstack::Elf::Object>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pstack::Elf::Object>_>_>_>
             ::begin(&this->elfCache);
    local_28._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pstack::Elf::Object>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pstack::Elf::Object>_>_>_>
         ::end(&this->elfCache);
    while (bVar1 = std::operator==(&__end2,&local_28), ((bVar1 ^ 0xffU) & 1) != 0) {
      __in = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pstack::Elf::Object>_>_>
             ::operator*(&__end2);
      std::get<0ul,std::__cxx11::string_const,std::shared_ptr<pstack::Elf::Object>>(__in);
      this_01 = (__shared_ptr_access<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 *)std::get<1ul,std::__cxx11::string_const,std::shared_ptr<pstack::Elf::Object>>
                             (__in);
      poVar2 = std::operator<<(this->debug,"\t");
      peVar3 = std::
               __shared_ptr_access<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->(this_01);
      reader = std::
               __shared_ptr_access<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator*((__shared_ptr_access<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&peVar3->io);
      poVar2 = pstack::operator<<(poVar2,reader);
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pstack::Elf::Object>_>_>
      ::operator++(&__end2);
    }
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&this->pathReplacements);
  std::unique_ptr<debuginfod_client,_pstack::Context::DidClose>::~unique_ptr(&this->debuginfod);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->debugDirectories);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pstack::Elf::Object>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pstack::Elf::Object>_>_>_>
  ::~map(&this->elfCache);
  std::
  map<std::shared_ptr<pstack::Elf::Object>,_std::shared_ptr<pstack::Dwarf::Info>,_std::less<std::shared_ptr<pstack::Elf::Object>_>,_std::allocator<std::pair<const_std::shared_ptr<pstack::Elf::Object>,_std::shared_ptr<pstack::Dwarf::Info>_>_>_>
  ::~map(&this->dwarfCache);
  return;
}

Assistant:

Context::~Context() noexcept {
    if (verbose >= 2) {
        *debug << "image cache: lookups: " << dwarfLookups << ", hits=" << dwarfHits << "\n"
               << "ELF image cache: lookups: " << elfLookups << ", hits=" << elfHits << std::endl;
        for (const auto &[name, elf] : elfCache) {
            *debug << "\t" << *elf->io << std::endl;
        }
    }
}